

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QMovableArrayOps<QPixmapIconEngineEntry>::emplace<QPixmapIconEngineEntry_const&>
          (QMovableArrayOps<QPixmapIconEngineEntry> *this,qsizetype i,QPixmapIconEngineEntry *args)

{
  QPixmapIconEngineEntry **ppQVar1;
  qsizetype *pqVar2;
  long lVar3;
  Data *pDVar4;
  qsizetype qVar5;
  long in_FS_OFFSET;
  bool bVar6;
  Inserter local_90;
  QPixmapIconEngineEntry tmp;
  
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar4 = (this->super_QGenericArrayOps<QPixmapIconEngineEntry>).
           super_QArrayDataPointer<QPixmapIconEngineEntry>.d;
  if ((pDVar4 != (Data *)0x0) &&
     ((__int_type)(pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int> < 2)) {
    if ((this->super_QGenericArrayOps<QPixmapIconEngineEntry>).
        super_QArrayDataPointer<QPixmapIconEngineEntry>.size == i) {
      qVar5 = QArrayDataPointer<QPixmapIconEngineEntry>::freeSpaceAtEnd
                        ((QArrayDataPointer<QPixmapIconEngineEntry> *)this);
      if (qVar5 == 0) goto LAB_0025da98;
      QPixmapIconEngineEntry::QPixmapIconEngineEntry
                ((this->super_QGenericArrayOps<QPixmapIconEngineEntry>).
                 super_QArrayDataPointer<QPixmapIconEngineEntry>.ptr +
                 (this->super_QGenericArrayOps<QPixmapIconEngineEntry>).
                 super_QArrayDataPointer<QPixmapIconEngineEntry>.size,args);
LAB_0025db88:
      pqVar2 = &(this->super_QGenericArrayOps<QPixmapIconEngineEntry>).
                super_QArrayDataPointer<QPixmapIconEngineEntry>.size;
      *pqVar2 = *pqVar2 + 1;
      goto LAB_0025db47;
    }
LAB_0025da98:
    if (i == 0) {
      qVar5 = QArrayDataPointer<QPixmapIconEngineEntry>::freeSpaceAtBegin
                        ((QArrayDataPointer<QPixmapIconEngineEntry> *)this);
      if (qVar5 != 0) {
        QPixmapIconEngineEntry::QPixmapIconEngineEntry
                  ((this->super_QGenericArrayOps<QPixmapIconEngineEntry>).
                   super_QArrayDataPointer<QPixmapIconEngineEntry>.ptr + -1,args);
        ppQVar1 = &(this->super_QGenericArrayOps<QPixmapIconEngineEntry>).
                   super_QArrayDataPointer<QPixmapIconEngineEntry>.ptr;
        *ppQVar1 = *ppQVar1 + -1;
        goto LAB_0025db88;
      }
    }
  }
  tmp.size = (QSize)&DAT_aaaaaaaaaaaaaaaa;
  tmp._56_8_ = &DAT_aaaaaaaaaaaaaaaa;
  tmp.fileName.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  tmp.fileName.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  tmp.pixmap.data.d.ptr = (totally_ordered_wrapper<QPlatformPixmap_*>)&DAT_aaaaaaaaaaaaaaaa;
  tmp.fileName.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  tmp.pixmap.super_QPaintDevice._vptr_QPaintDevice = (_func_int **)&DAT_aaaaaaaaaaaaaaaa;
  tmp.pixmap.super_QPaintDevice._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QPixmapIconEngineEntry::QPixmapIconEngineEntry(&tmp,args);
  bVar6 = (this->super_QGenericArrayOps<QPixmapIconEngineEntry>).
          super_QArrayDataPointer<QPixmapIconEngineEntry>.size != 0;
  QArrayDataPointer<QPixmapIconEngineEntry>::detachAndGrow
            ((QArrayDataPointer<QPixmapIconEngineEntry> *)this,(uint)(i == 0 && bVar6),1,
             (QPixmapIconEngineEntry **)0x0,(QArrayDataPointer<QPixmapIconEngineEntry> *)0x0);
  if (i == 0 && bVar6) {
    QPixmapIconEngineEntry::QPixmapIconEngineEntry
              ((this->super_QGenericArrayOps<QPixmapIconEngineEntry>).
               super_QArrayDataPointer<QPixmapIconEngineEntry>.ptr + -1,&tmp);
    ppQVar1 = &(this->super_QGenericArrayOps<QPixmapIconEngineEntry>).
               super_QArrayDataPointer<QPixmapIconEngineEntry>.ptr;
    *ppQVar1 = *ppQVar1 + -1;
    pqVar2 = &(this->super_QGenericArrayOps<QPixmapIconEngineEntry>).
              super_QArrayDataPointer<QPixmapIconEngineEntry>.size;
    *pqVar2 = *pqVar2 + 1;
  }
  else {
    Inserter::Inserter(&local_90,(QArrayDataPointer<QPixmapIconEngineEntry> *)this,i,1);
    QPixmapIconEngineEntry::QPixmapIconEngineEntry(local_90.displaceFrom,&tmp);
    local_90.displaceFrom = local_90.displaceFrom + 1;
    Inserter::~Inserter(&local_90);
  }
  QPixmapIconEngineEntry::~QPixmapIconEngineEntry(&tmp);
LAB_0025db47:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar3) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }